

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxStaticArray::Emit(FxStaticArray *this,VMFunctionBuilder *build)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int *values;
  double *values_00;
  FString *ptrs;
  FxExpression **ppFVar5;
  void **ptrs_00;
  undefined1 local_150 [16];
  void *local_140;
  PType *local_138;
  FxExpression *v_3;
  iterator __end2_3;
  iterator __begin2_3;
  FArgumentList *__range2_3;
  TArray<void_*,_void_*> cvalues_3;
  ExpVal local_f8;
  FxExpression *v_2;
  iterator __end2_2;
  iterator __begin2_2;
  FArgumentList *__range2_2;
  TArray<FString,_FString> cvalues_2;
  double local_b0;
  FxExpression *local_a8;
  FxExpression *v_1;
  iterator __end2_1;
  iterator __begin2_1;
  FArgumentList *__range2_1;
  TArray<double,_double> cvalues_1;
  int local_64;
  FxExpression *local_60;
  FxExpression *v;
  iterator __end2;
  TIterator<FxExpression_*> local_40;
  iterator __begin2;
  FArgumentList *__range2;
  TArray<int,_int> cvalues;
  VMFunctionBuilder *build_local;
  FxStaticArray *this_local;
  
  cvalues._8_8_ = build;
  iVar3 = PType::GetRegType(this->ElementType);
  switch(iVar3) {
  case 0:
    TArray<int,_int>::TArray((TArray<int,_int> *)&__range2);
    __begin2.m_ptr = (FxExpression **)&this->values;
    local_40.m_ptr =
         (FxExpression **)
         TArray<FxExpression_*,_FxExpression_*>::begin
                   ((TArray<FxExpression_*,_FxExpression_*> *)__begin2.m_ptr);
    v = (FxExpression *)
        TArray<FxExpression_*,_FxExpression_*>::end
                  ((TArray<FxExpression_*,_FxExpression_*> *)__begin2.m_ptr);
    while (bVar2 = TIterator<FxExpression_*>::operator!=(&local_40,(TIterator<FxExpression_*> *)&v),
          uVar1 = cvalues._8_8_, bVar2) {
      ppFVar5 = TIterator<FxExpression_*>::operator*(&local_40);
      local_60 = *ppFVar5;
      FxConstant::GetValue((FxConstant *)&cvalues_1.Most);
      local_64 = ExpVal::GetInt((ExpVal *)&cvalues_1.Most);
      TArray<int,_int>::Push((TArray<int,_int> *)&__range2,&local_64);
      ExpVal::~ExpVal((ExpVal *)&cvalues_1.Most);
      TIterator<FxExpression_*>::operator++(&local_40);
    }
    uVar4 = TArray<int,_int>::Size((TArray<int,_int> *)&__range2);
    values = TArray<int,_int>::operator[]((TArray<int,_int> *)&__range2,0);
    uVar4 = VMFunctionBuilder::AllocConstantsInt((VMFunctionBuilder *)uVar1,uVar4,values);
    (this->super_FxLocalVariableDeclaration).StackOffset = uVar4;
    TArray<int,_int>::~TArray((TArray<int,_int> *)&__range2);
    break;
  case 1:
    TArray<double,_double>::TArray((TArray<double,_double> *)&__range2_1);
    __end2_1 = TArray<FxExpression_*,_FxExpression_*>::begin
                         (&(this->values).super_TArray<FxExpression_*,_FxExpression_*>);
    v_1 = (FxExpression *)
          TArray<FxExpression_*,_FxExpression_*>::end
                    (&(this->values).super_TArray<FxExpression_*,_FxExpression_*>);
    while (bVar2 = TIterator<FxExpression_*>::operator!=
                             (&__end2_1,(TIterator<FxExpression_*> *)&v_1), uVar1 = cvalues._8_8_,
          bVar2) {
      ppFVar5 = TIterator<FxExpression_*>::operator*(&__end2_1);
      local_a8 = *ppFVar5;
      FxConstant::GetValue((FxConstant *)&cvalues_2.Most);
      local_b0 = ExpVal::GetFloat((ExpVal *)&cvalues_2.Most);
      TArray<double,_double>::Push((TArray<double,_double> *)&__range2_1,&local_b0);
      ExpVal::~ExpVal((ExpVal *)&cvalues_2.Most);
      TIterator<FxExpression_*>::operator++(&__end2_1);
    }
    uVar4 = TArray<double,_double>::Size((TArray<double,_double> *)&__range2_1);
    values_00 = TArray<double,_double>::operator[]((TArray<double,_double> *)&__range2_1,0);
    uVar4 = VMFunctionBuilder::AllocConstantsFloat((VMFunctionBuilder *)uVar1,uVar4,values_00);
    (this->super_FxLocalVariableDeclaration).StackOffset = uVar4;
    TArray<double,_double>::~TArray((TArray<double,_double> *)&__range2_1);
    break;
  case 2:
    TArray<FString,_FString>::TArray((TArray<FString,_FString> *)&__range2_2);
    __end2_2 = TArray<FxExpression_*,_FxExpression_*>::begin
                         (&(this->values).super_TArray<FxExpression_*,_FxExpression_*>);
    v_2 = (FxExpression *)
          TArray<FxExpression_*,_FxExpression_*>::end
                    (&(this->values).super_TArray<FxExpression_*,_FxExpression_*>);
    while (bVar2 = TIterator<FxExpression_*>::operator!=
                             (&__end2_2,(TIterator<FxExpression_*> *)&v_2), uVar1 = cvalues._8_8_,
          bVar2) {
      ppFVar5 = TIterator<FxExpression_*>::operator*(&__end2_2);
      local_f8.field_1.pointer = *ppFVar5;
      FxConstant::GetValue((FxConstant *)&cvalues_3.Most);
      ExpVal::GetString(&local_f8);
      TArray<FString,_FString>::Push((TArray<FString,_FString> *)&__range2_2,(FString *)&local_f8);
      FString::~FString((FString *)&local_f8);
      ExpVal::~ExpVal((ExpVal *)&cvalues_3.Most);
      TIterator<FxExpression_*>::operator++(&__end2_2);
    }
    uVar4 = TArray<FString,_FString>::Size((TArray<FString,_FString> *)&__range2_2);
    ptrs = TArray<FString,_FString>::operator[]((TArray<FString,_FString> *)&__range2_2,0);
    uVar4 = VMFunctionBuilder::AllocConstantsString((VMFunctionBuilder *)uVar1,uVar4,ptrs);
    (this->super_FxLocalVariableDeclaration).StackOffset = uVar4;
    TArray<FString,_FString>::~TArray((TArray<FString,_FString> *)&__range2_2);
    break;
  case 3:
    TArray<void_*,_void_*>::TArray((TArray<void_*,_void_*> *)&__range2_3);
    __end2_3 = TArray<FxExpression_*,_FxExpression_*>::begin
                         (&(this->values).super_TArray<FxExpression_*,_FxExpression_*>);
    v_3 = (FxExpression *)
          TArray<FxExpression_*,_FxExpression_*>::end
                    (&(this->values).super_TArray<FxExpression_*,_FxExpression_*>);
    while (bVar2 = TIterator<FxExpression_*>::operator!=
                             (&__end2_3,(TIterator<FxExpression_*> *)&v_3), uVar1 = cvalues._8_8_,
          bVar2) {
      ppFVar5 = TIterator<FxExpression_*>::operator*(&__end2_3);
      local_138 = (PType *)*ppFVar5;
      FxConstant::GetValue((FxConstant *)local_150);
      local_140 = ExpVal::GetPointer((ExpVal *)local_150);
      TArray<void_*,_void_*>::Push((TArray<void_*,_void_*> *)&__range2_3,&local_140);
      ExpVal::~ExpVal((ExpVal *)local_150);
      TIterator<FxExpression_*>::operator++(&__end2_3);
    }
    uVar4 = TArray<void_*,_void_*>::Size((TArray<void_*,_void_*> *)&__range2_3);
    ptrs_00 = TArray<void_*,_void_*>::operator[]((TArray<void_*,_void_*> *)&__range2_3,0);
    iVar3 = PType::GetLoadOp(this->ElementType);
    uVar4 = VMFunctionBuilder::AllocConstantsAddress
                      ((VMFunctionBuilder *)uVar1,uVar4,ptrs_00,iVar3 == 0x1c);
    (this->super_FxLocalVariableDeclaration).StackOffset = uVar4;
    TArray<void_*,_void_*>::~TArray((TArray<void_*,_void_*> *)&__range2_3);
    break;
  default:
    __assert_fail("false && \"Invalid register type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x2789,"virtual ExpEmit FxStaticArray::Emit(VMFunctionBuilder *)");
  }
  ExpEmit::ExpEmit((ExpEmit *)&this_local);
  return (ExpEmit)this_local;
}

Assistant:

ExpEmit FxStaticArray::Emit(VMFunctionBuilder *build)
{
	switch (ElementType->GetRegType())
	{
	default:
		assert(false && "Invalid register type");
		break;

	case REGT_INT:
	{
		TArray<int> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetInt());
		StackOffset = build->AllocConstantsInt(cvalues.Size(), &cvalues[0]);
		break;
	}
	case REGT_FLOAT:
	{
		TArray<double> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetFloat());
		StackOffset = build->AllocConstantsFloat(cvalues.Size(), &cvalues[0]);
		break;
	}
	case REGT_STRING:
	{
		TArray<FString> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetString());
		StackOffset = build->AllocConstantsString(cvalues.Size(), &cvalues[0]);
		break;
	}
	case REGT_POINTER:
	{
		TArray<void*> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetPointer());
		StackOffset = build->AllocConstantsAddress(cvalues.Size(), &cvalues[0], ElementType->GetLoadOp() == OP_LO ? ATAG_OBJECT : ATAG_GENERIC);
		break;
	}
	}
	return ExpEmit();
}